

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

void __thiscall leveldb::Harness::Test(Harness *this,Random *rnd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_color _Var3;
  Harness *pHVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  STLLessThan SVar9;
  undefined4 extraout_var_00;
  long lVar10;
  long *plVar11;
  _Rb_tree_node_base *p_Var12;
  undefined4 extraout_var_01;
  ulong uVar13;
  _Rb_tree_color _Var14;
  KVMap *kvmap;
  size_type *psVar15;
  string key;
  KVMap data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  string last;
  string local_2a8;
  Harness *local_288;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [16];
  _Base_ptr local_230;
  STLLessThan local_228;
  _Rb_tree_node_base *local_220;
  size_t local_218;
  undefined1 local_210 [48];
  Constructor *pCStack_1e0;
  undefined8 local_1d8;
  Tester local_1d0;
  Iterator *pIVar8;
  
  local_210._40_8_ = (FilterPolicy *)0x0;
  pCStack_1e0 = (Constructor *)0x0;
  local_1d8 = 0;
  local_210._32_8_ = rnd;
  local_240._0_8_ = BytewiseComparator();
  local_228.cmp = (Comparator *)(local_240 + 8);
  local_240._8_4_ = _S_red;
  local_230 = (_Base_ptr)0x0;
  local_218 = 0;
  kvmap = (KVMap *)local_240;
  local_220 = (_Rb_tree_node_base *)local_228.cmp;
  Constructor::Finish(this->constructor_,&this->options_,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_210 + 0x28),kvmap);
  iVar6 = (*this->constructor_->_vptr_Constructor[3])();
  pIVar8 = (Iterator *)CONCAT44(extraout_var,iVar6);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_1d0.line_ = 0x1c9;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  iVar6 = (*pIVar8->_vptr_Iterator[2])(pIVar8);
  test::Tester::Is(&local_1d0,(bool)((byte)iVar6 ^ 1),"!iter->Valid()");
  test::Tester::~Tester(&local_1d0);
  (*pIVar8->_vptr_Iterator[3])(pIVar8);
  local_210._0_8_ = local_228.cmp;
  local_288 = this;
  if ((_Rb_tree_node_base *)local_228.cmp != (_Rb_tree_node_base *)(local_240 + 8)) {
    SVar9.cmp = local_228.cmp;
    do {
      local_1d0.ok_ = true;
      local_1d0.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
      ;
      local_1d0.line_ = 0x1cd;
      local_210._0_8_ = SVar9.cmp;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
      ToString(&local_2a8,(Harness *)local_240,(KVMap *)local_210,(const_iterator *)kvmap);
      ToString_abi_cxx11_(&local_280,local_288,pIVar8);
      test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
                (&local_1d0,&local_2a8,&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      test::Tester::~Tester(&local_1d0);
      (*pIVar8->_vptr_Iterator[6])(pIVar8);
      SVar9.cmp = (Comparator *)std::_Rb_tree_increment((_Rb_tree_node_base *)SVar9.cmp);
      local_210._0_8_ = SVar9.cmp;
    } while ((_Rb_tree_node_base *)SVar9.cmp != (_Rb_tree_node_base *)(local_240 + 8));
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_1d0.line_ = 0x1d0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pHVar4 = local_288;
  iVar6 = (*pIVar8->_vptr_Iterator[2])(pIVar8);
  test::Tester::Is(&local_1d0,(bool)((byte)iVar6 ^ 1),"!iter->Valid()");
  test::Tester::~Tester(&local_1d0);
  (*pIVar8->_vptr_Iterator[1])(pIVar8);
  iVar6 = (*pHVar4->constructor_->_vptr_Constructor[3])();
  pIVar8 = (Iterator *)CONCAT44(extraout_var_00,iVar6);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_1d0.line_ = 0x1d7;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  iVar6 = (*pIVar8->_vptr_Iterator[2])(pIVar8);
  test::Tester::Is(&local_1d0,(bool)((byte)iVar6 ^ 1),"!iter->Valid()");
  test::Tester::~Tester(&local_1d0);
  (*pIVar8->_vptr_Iterator[4])(pIVar8);
  if ((_Rb_tree_node_base *)(local_240 + 8) != (_Rb_tree_node_base *)local_228.cmp) {
    paVar1 = &local_2a8.field_2;
    paVar2 = &local_260.field_2;
    p_Var12 = (_Rb_tree_node_base *)(local_240 + 8);
    do {
      local_1d0.ok_ = true;
      local_1d0.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
      ;
      local_1d0.line_ = 0x1db;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
      if (p_Var12 == (_Rb_tree_node_base *)local_228.cmp) {
        local_260._M_string_length = 3;
        local_260.field_2._M_allocated_capacity._0_4_ = 0x444e45;
        local_260._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        lVar10 = std::_Rb_tree_decrement(p_Var12);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210,"\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar10 + 0x20));
        plVar11 = (long *)std::__cxx11::string::append((char *)local_210);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_280.field_2._M_allocated_capacity = *psVar15;
          local_280.field_2._8_8_ = plVar11[3];
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar15;
          local_280._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_280._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        lVar10 = std::_Rb_tree_decrement(p_Var12);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_280,*(ulong *)(lVar10 + 0x40));
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_2a8.field_2._M_allocated_capacity = *psVar15;
          local_2a8.field_2._8_8_ = plVar11[3];
          local_2a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2a8.field_2._M_allocated_capacity = *psVar15;
          local_2a8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_2a8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_260.field_2._M_allocated_capacity = *psVar15;
          local_260.field_2._8_8_ = plVar11[3];
          local_260._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_260.field_2._M_allocated_capacity = *psVar15;
          local_260._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_260._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        if ((Comparator *)local_210._0_8_ != (Comparator *)(local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_);
        }
      }
      ToString_abi_cxx11_(&local_2a8,local_288,pIVar8);
      test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
                (&local_1d0,&local_260,&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      test::Tester::~Tester(&local_1d0);
      (*pIVar8->_vptr_Iterator[7])(pIVar8);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var12);
    } while (p_Var12 != (_Rb_tree_node_base *)local_228.cmp);
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_1d0.line_ = 0x1de;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pHVar4 = local_288;
  iVar6 = (*pIVar8->_vptr_Iterator[2])(pIVar8);
  test::Tester::Is(&local_1d0,(bool)((byte)iVar6 ^ 1),"!iter->Valid()");
  test::Tester::~Tester(&local_1d0);
  (*pIVar8->_vptr_Iterator[1])(pIVar8);
  iVar6 = (*pHVar4->constructor_->_vptr_Constructor[3])();
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
  ;
  local_1d0.line_ = 0x1e6;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  bVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x10))
                    ((long *)CONCAT44(extraout_var_01,iVar6));
  test::Tester::Is(&local_1d0,(bool)(bVar5 ^ 1),"!iter->Valid()");
  test::Tester::~Tester(&local_1d0);
  local_260._M_dataplus._M_p = (pointer)local_228.cmp;
  uVar13 = (ulong)*(_Rb_tree_color *)local_210._32_8_ * 0x41a7;
  uVar7 = (uint)uVar13 & 0x7fffffff;
  iVar6 = (int)(uVar13 >> 0x1f);
  _Var14 = iVar6 + uVar7;
  _Var3 = iVar6 + uVar7 + 0x80000001;
  if (-1 < (int)_Var14) {
    _Var3 = _Var14;
  }
  *(_Rb_tree_color *)local_210._32_8_ = _Var3;
  (*(code *)(&DAT_0012911c + *(int *)(&DAT_0012911c + (ulong)(_Var3 % 5) * 4)))();
  return;
}

Assistant:

void Test(Random* rnd) {
    std::vector<std::string> keys;
    KVMap data;
    constructor_->Finish(options_, &keys, &data);

    TestForwardScan(keys, data);
    TestBackwardScan(keys, data);
    TestRandomAccess(rnd, keys, data);
  }